

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O2

char * lj_strfmt_pushvf(lua_State *L,char *fmt,__va_list_tag *argp)

{
  SBuf *sb;
  uint uVar1;
  undefined4 uVar2;
  uint64_t uVar3;
  TValue *pTVar4;
  SFormat sf;
  size_t sVar5;
  long *plVar6;
  lua_Number *plVar7;
  undefined4 *puVar8;
  undefined8 *puVar9;
  char *pcVar10;
  GCstr *pGVar11;
  uint *puVar12;
  int *piVar13;
  uint64_t k;
  FormatState fs;
  
  uVar3 = (L->glref).ptr64;
  sb = (SBuf *)(uVar3 + 200);
  *(lua_State **)(uVar3 + 0xe0) = L;
  *(undefined8 *)(uVar3 + 200) = *(undefined8 *)(uVar3 + 0xd8);
  sVar5 = strlen(fmt);
  fs.e = (uint8_t *)(fmt + (sVar5 & 0xffffffff));
  fs.p = (uint8_t *)fmt;
LAB_00116d41:
  sf = lj_strfmt_parse(&fs);
  if (sf == 0) {
    pGVar11 = lj_str_new(L,*(char **)(uVar3 + 0xd8),
                         (ulong)(uint)(*(int *)(uVar3 + 200) - (int)*(char **)(uVar3 + 0xd8)));
    L->top->u64 = (ulong)pGVar11 | 0xfffd800000000000;
    pTVar4 = L->top;
    L->top = pTVar4 + 1;
    if ((TValue *)(L->maxstack).ptr64 <= pTVar4 + 1) {
      lj_state_growstack1(L);
    }
    return (char *)(pGVar11 + 1);
  }
  switch(sf & 0xf) {
  case 2:
    lj_buf_putmem(sb,fs.str,fs.len);
    goto LAB_00116d41;
  case 3:
    uVar1 = argp->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      piVar13 = (int *)((ulong)uVar1 + (long)argp->reg_save_area);
      argp->gp_offset = uVar1 + 8;
    }
    else {
      piVar13 = (int *)argp->overflow_arg_area;
      argp->overflow_arg_area = piVar13 + 2;
    }
    k = (uint64_t)*piVar13;
    break;
  case 4:
    uVar1 = argp->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar12 = (uint *)((ulong)uVar1 + (long)argp->reg_save_area);
      argp->gp_offset = uVar1 + 8;
    }
    else {
      puVar12 = (uint *)argp->overflow_arg_area;
      argp->overflow_arg_area = puVar12 + 2;
    }
    k = (uint64_t)*puVar12;
    break;
  case 5:
    uVar1 = argp->fp_offset;
    if ((ulong)uVar1 < 0xa1) {
      plVar7 = (lua_Number *)((ulong)uVar1 + (long)argp->reg_save_area);
      argp->fp_offset = uVar1 + 0x10;
    }
    else {
      plVar7 = (lua_Number *)argp->overflow_arg_area;
      argp->overflow_arg_area = plVar7 + 1;
    }
    lj_strfmt_putfnum(sb,0xf000035,*plVar7);
    goto LAB_00116d41;
  case 6:
    uVar1 = argp->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar6 = (long *)((ulong)uVar1 + (long)argp->reg_save_area);
      argp->gp_offset = uVar1 + 8;
    }
    else {
      plVar6 = (long *)argp->overflow_arg_area;
      argp->overflow_arg_area = plVar6 + 1;
    }
    pcVar10 = (char *)*plVar6;
    if (pcVar10 == (char *)0x0) {
      pcVar10 = "(null)";
    }
    sVar5 = strlen(pcVar10);
    lj_buf_putmem(sb,pcVar10,(MSize)sVar5);
    goto LAB_00116d41;
  case 7:
    uVar1 = argp->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar8 = (undefined4 *)((ulong)uVar1 + (long)argp->reg_save_area);
      argp->gp_offset = uVar1 + 8;
    }
    else {
      puVar8 = (undefined4 *)argp->overflow_arg_area;
      argp->overflow_arg_area = puVar8 + 2;
    }
    uVar2 = *puVar8;
    pcVar10 = *(char **)(uVar3 + 200);
    if (*(int *)(uVar3 + 0xd0) == (int)pcVar10) {
      pcVar10 = lj_buf_more2(sb,1);
    }
    *pcVar10 = (char)uVar2;
    goto LAB_00116efc;
  case 8:
    goto switchD_00116d65_caseD_8;
  default:
    pcVar10 = *(char **)(uVar3 + 200);
    if (*(int *)(uVar3 + 0xd0) == (int)pcVar10) {
      pcVar10 = lj_buf_more2(sb,1);
    }
    *pcVar10 = '?';
LAB_00116efc:
    sb->w = pcVar10 + 1;
    goto LAB_00116d41;
  }
  lj_strfmt_putfxint(sb,sf,k);
  goto LAB_00116d41;
switchD_00116d65_caseD_8:
  uVar1 = argp->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar9 = (undefined8 *)((ulong)uVar1 + (long)argp->reg_save_area);
    argp->gp_offset = uVar1 + 8;
  }
  else {
    puVar9 = (undefined8 *)argp->overflow_arg_area;
    argp->overflow_arg_area = puVar9 + 1;
  }
  lj_strfmt_putptr(sb,(void *)*puVar9);
  goto LAB_00116d41;
}

Assistant:

const char *lj_strfmt_pushvf(lua_State *L, const char *fmt, va_list argp)
{
  SBuf *sb = lj_buf_tmp_(L);
  FormatState fs;
  SFormat sf;
  GCstr *str;
  lj_strfmt_init(&fs, fmt, (MSize)strlen(fmt));
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      lj_buf_putmem(sb, fs.str, fs.len);
      break;
    case STRFMT_INT:
      lj_strfmt_putfxint(sb, sf, va_arg(argp, int32_t));
      break;
    case STRFMT_UINT:
      lj_strfmt_putfxint(sb, sf, va_arg(argp, uint32_t));
      break;
    case STRFMT_NUM:
      lj_strfmt_putfnum(sb, STRFMT_G14, va_arg(argp, lua_Number));
      break;
    case STRFMT_STR: {
      const char *s = va_arg(argp, char *);
      if (s == NULL) s = "(null)";
      lj_buf_putmem(sb, s, (MSize)strlen(s));
      break;
      }
    case STRFMT_CHAR:
      lj_buf_putb(sb, va_arg(argp, int));
      break;
    case STRFMT_PTR:
      lj_strfmt_putptr(sb, va_arg(argp, void *));
      break;
    case STRFMT_ERR:
    default:
      lj_buf_putb(sb, '?');
      lj_assertL(0, "bad string format near offset %d", fs.len);
      break;
    }
  }
  str = lj_buf_str(L, sb);
  setstrV(L, L->top, str);
  incr_top(L);
  return strdata(str);
}